

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MaterialRenderer.cpp
# Opt level: O2

bool __thiscall
irr::video::COpenGL3MaterialRenderer::createShader
          (COpenGL3MaterialRenderer *this,GLenum shaderType,char *shader)

{
  GLint GVar1;
  GLuint GVar2;
  Printer *this_00;
  bool bVar3;
  double dVar4;
  char *shader_local;
  GLint length;
  GLint maxLength;
  GLint status;
  
  bVar3 = true;
  if (this->Program != 0) {
    shader_local = shader;
    GVar2 = (*GL.CreateShader)(shaderType);
    (*GL.ShaderSource)(GVar2,1,&shader_local,(GLint *)0x0);
    (*GL.CompileShader)(GVar2);
    status = 0;
    dVar4 = (double)(*GL.GetShaderiv)(GVar2,0x8b81,&status);
    if (status == 1) {
      (*GL.AttachShader)(this->Program,GVar2);
    }
    else {
      os::Printer::log((Printer *)"GLSL shader failed to compile",dVar4);
      maxLength = 0;
      (*GL.GetShaderiv)(GVar2,0x8b84,&maxLength);
      GVar1 = maxLength;
      if ((long)maxLength != 0) {
        this_00 = (Printer *)operator_new__((long)maxLength);
        dVar4 = (double)(*GL.GetShaderInfoLog)(GVar2,GVar1,&length,(GLchar *)this_00);
        os::Printer::log(this_00,dVar4);
        operator_delete__(this_00);
      }
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool COpenGL3MaterialRenderer::createShader(GLenum shaderType, const char *shader)
{
	if (Program) {
		GLuint shaderHandle = GL.CreateShader(shaderType);
		GL.ShaderSource(shaderHandle, 1, &shader, NULL);
		GL.CompileShader(shaderHandle);

		GLint status = 0;

		GL.GetShaderiv(shaderHandle, GL_COMPILE_STATUS, &status);

		if (status != GL_TRUE) {
			os::Printer::log("GLSL shader failed to compile", ELL_ERROR);

			GLint maxLength = 0;
			GLint length;

			GL.GetShaderiv(shaderHandle, GL_INFO_LOG_LENGTH,
					&maxLength);

			if (maxLength) {
				GLchar *infoLog = new GLchar[maxLength];
				GL.GetShaderInfoLog(shaderHandle, maxLength, &length, infoLog);
				os::Printer::log(reinterpret_cast<const c8 *>(infoLog), ELL_ERROR);
				delete[] infoLog;
			}

			return false;
		}

		GL.AttachShader(Program, shaderHandle);
	}

	return true;
}